

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  uint uVar1;
  ImGuiOldColumns *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiWindow *pIVar5;
  ImGuiOldColumnData *pIVar6;
  float fVar7;
  float _y;
  float fVar8;
  float x_1;
  int n_1;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiOldColumnData *column;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiOldColumnFlags flags;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID in_stack_ffffffffffffff64;
  ImDrawList *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float idx;
  int in_stack_ffffffffffffff7c;
  ImVec2 in_stack_ffffffffffffff80;
  ImVec2 local_78;
  float in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  ushort in_stack_ffffffffffffff98;
  byte bVar9;
  byte bVar10;
  float in_stack_ffffffffffffff9c;
  bool *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImRect *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  undefined4 uVar11;
  ImDrawList *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int i;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar12;
  bool local_1d;
  
  pIVar3 = GImGui;
  pIVar5 = GetCurrentWindow();
  pIVar2 = (pIVar5->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge
              ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  uVar1 = pIVar2->Flags;
  fVar7 = ImMax<float>(pIVar2->LineMaxY,(pIVar5->DC).CursorPos.y);
  pIVar2->LineMaxY = fVar7;
  (pIVar5->DC).CursorPos.y = pIVar2->LineMaxY;
  if ((uVar1 & 0x10) == 0) {
    (pIVar5->DC).CursorMaxPos.x = pIVar2->HostCursorMaxPosX;
  }
  local_1d = false;
  if (((uVar1 & 1) == 0) && ((pIVar5->SkipItems & 1U) == 0)) {
    fVar7 = ImMax<float>(pIVar2->HostCursorPosY,(pIVar5->ClipRect).Min.y);
    _y = ImMin<float>((pIVar5->DC).CursorPos.y,(pIVar5->ClipRect).Max.y);
    iVar12 = -1;
    for (i = 1; i < pIVar2->Count; i = i + 1) {
      pIVar6 = ImVector<ImGuiOldColumnData>::operator[](&pIVar2->Columns,i);
      idx = (pIVar5->Pos).x;
      fVar8 = GetColumnOffset((int)in_stack_ffffffffffffff70);
      fVar8 = idx + fVar8;
      id = pIVar2->ID + i;
      uVar11 = 0x40800000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,fVar8 - 4.0,fVar7);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,fVar8 + 4.0,_y);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffac,(ImVec2 *)&stack0xffffffffffffffa4,
                     (ImVec2 *)&stack0xffffffffffffff9c);
      KeepAliveID(id);
      bVar4 = IsClippedEx((ImRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      if (!bVar4) {
        bVar10 = 0;
        bVar9 = 0;
        if ((uVar1 & 2) == 0) {
          ButtonBehavior(in_stack_ffffffffffffffb0,(ImGuiID)in_stack_ffffffffffffffac,
                         in_stack_ffffffffffffffa0,
                         (bool *)CONCAT44(in_stack_ffffffffffffff9c,(uint)in_stack_ffffffffffffff98)
                         ,in_stack_ffffffffffffff94);
          if (((bVar10 & 1) != 0) || ((bVar9 & 1) != 0)) {
            pIVar3->MouseCursor = 4;
          }
          if (((bVar9 & 1) != 0) && ((pIVar6->Flags & 2U) == 0)) {
            iVar12 = i;
          }
        }
        if ((bVar9 & 1) == 0) {
          in_stack_ffffffffffffff70 = 3.78351e-44;
          if ((bVar10 & 1) != 0) {
            in_stack_ffffffffffffff70 = 3.92364e-44;
          }
        }
        else {
          in_stack_ffffffffffffff70 = 4.06377e-44;
        }
        in_stack_ffffffffffffff94 = GetColorU32((ImGuiCol)idx,in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff90 = (float)(int)fVar8;
        in_stack_ffffffffffffff68 = pIVar5->DrawList;
        ImVec2::ImVec2(&local_78,in_stack_ffffffffffffff90,fVar7 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,in_stack_ffffffffffffff90,_y);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(fVar8,id),
                            (ImVec2 *)CONCAT44(uVar11,in_stack_ffffffffffffffb8),
                            &in_stack_ffffffffffffffb0->Min,(ImU32)in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
      }
    }
    if (iVar12 != -1) {
      if ((pIVar2->IsBeingResized & 1U) == 0) {
        for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < pIVar2->Count + 1;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          pIVar6 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar2->Columns,in_stack_ffffffffffffff7c);
          fVar7 = pIVar6->OffsetNorm;
          pIVar6 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar2->Columns,in_stack_ffffffffffffff7c);
          pIVar6->OffsetNormBeforeResize = fVar7;
        }
      }
      local_1d = true;
      pIVar2->IsBeingResized = true;
      GetDraggedColumnOffset((ImGuiOldColumns *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
      ;
      SetColumnOffset(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    }
  }
  pIVar2->IsBeingResized = local_1d;
  (pIVar5->WorkRect).Min = (pIVar5->ParentWorkRect).Min;
  (pIVar5->WorkRect).Max = (pIVar5->ParentWorkRect).Max;
  (pIVar5->ParentWorkRect).Min = (pIVar2->HostBackupParentWorkRect).Min;
  (pIVar5->ParentWorkRect).Max = (pIVar2->HostBackupParentWorkRect).Max;
  (pIVar5->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar5->DC).ColumnsOffset.x = 0.0;
  (pIVar5->DC).CursorPos.x =
       (float)(int)((pIVar5->Pos).x + (pIVar5->DC).Indent.x + (pIVar5->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id)) // FIXME: Can be removed or replaced with a lower-level test
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}